

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkState.cpp
# Opt level: O2

void __thiscall xmrig::NetworkState::add(NetworkState *this,SubmitResult *result,char *error)

{
  ulong uVar1;
  unsigned_short local_22;
  reverse_iterator<unsigned_long_*> local_20;
  reverse_iterator<unsigned_long_*> local_18;
  
  if (error == (char *)0x0) {
    this->accepted = this->accepted + 1;
    this->total = this->total + result->diff;
    if ((this->topDiff)._M_elems[9] < result->actualDiff) {
      local_18.current = &this->accepted;
      local_20.current = (this->topDiff)._M_elems;
      (this->topDiff)._M_elems[9] = result->actualDiff;
      std::sort<std::reverse_iterator<unsigned_long*>>(&local_18,&local_20);
    }
    uVar1 = 0xffff;
    if (result->elapsed < 0xffff) {
      uVar1 = result->elapsed;
    }
    local_22 = (unsigned_short)uVar1;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
              (&this->m_latency,&local_22);
  }
  else {
    this->rejected = this->rejected + 1;
  }
  return;
}

Assistant:

void xmrig::NetworkState::add(const SubmitResult &result, const char *error)
{
    if (error) {
        rejected++;
        return;
    }

    accepted++;
    total += result.diff;

    const size_t ln = topDiff.size() - 1;
    if (result.actualDiff > topDiff[ln]) {
        topDiff[ln] = result.actualDiff;
        std::sort(topDiff.rbegin(), topDiff.rend());
    }

    m_latency.push_back(result.elapsed > 0xFFFF ? 0xFFFF : static_cast<uint16_t>(result.elapsed));
}